

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O2

void __thiscall memory::memory(memory *this,longlong cap)

{
  int i;
  uchar *puVar1;
  long lVar2;
  
  this->PC = 0;
  this->count = 0;
  this->capacity = cap;
  puVar1 = (uchar *)operator_new__(cap);
  this->mem = puVar1;
  this->jump_flag = false;
  for (lVar2 = 0; lVar2 < cap; lVar2 = lVar2 + 1) {
    this->mem[lVar2] = '\0';
    cap = this->capacity;
  }
  return;
}

Assistant:

memory::memory(long long cap) {
   PC=0;
   count=0;
   capacity=cap;
   mem=new unsigned char[cap];
   jump_flag=false;
   for(int i=0;i<capacity;++i){
       mem[i]=0;
   }
}